

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internaltypes.cpp
# Opt level: O2

void __thiscall
libcellml::HistoryEpoch::setReferenceName(HistoryEpoch *this,ImportedEntityConstPtr *importedEntity)

{
  bool bVar1;
  string local_30;
  
  bVar1 = ImportedEntity::isImport
                    ((importedEntity->
                     super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>
                     )._M_ptr);
  if (bVar1) {
    ImportedEntity::importReference_abi_cxx11_
              (&local_30,
               (importedEntity->
               super___shared_ptr<const_libcellml::ImportedEntity,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::__cxx11::string::operator=((string *)&this->mReferenceName,(string *)&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return;
}

Assistant:

void HistoryEpoch::setReferenceName(const ImportedEntityConstPtr &importedEntity)
{
    if (importedEntity->isImport()) {
        mReferenceName = importedEntity->importReference();
    }
}